

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O1

int doloot(void)

{
  boolean bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  obj *poVar7;
  permonst *ptr;
  ulong uVar8;
  int iVar9;
  obj **obj;
  void *__ptr;
  int i;
  char *line;
  int j;
  uint uVar10;
  long lVar11;
  char *pcVar12;
  int x;
  monst *pmVar13;
  ulong uVar14;
  bool bVar15;
  coord cc;
  boolean prev_loot;
  int prev_inquiry;
  object_pick *lootlist;
  coord local_53;
  boolean local_51;
  ulong local_50;
  undefined4 local_48;
  int local_44;
  object_pick *local_40;
  d_level *local_38;
  
  local_44 = 0;
  local_51 = '\0';
  bVar1 = check_capacity((char *)0x0);
  uVar14 = 0;
  if (bVar1 == '\0') {
    if (((youmonst.data)->mflags1 & 0x2000) == 0) {
      local_53.x = u.ux;
      local_53.y = u.uy;
      iVar5 = -1;
      local_48 = (undefined4)CONCAT71((uint7)u.uy,1);
      local_38 = &u.uz;
      uVar10 = 0;
      local_50 = 0x3196f0;
LAB_002122fe:
      x = (int)local_53.x;
      iVar9 = (int)local_53.y;
      iVar2 = container_at(x,iVar9,'\x01');
      if (iVar2 == 0) {
        uVar14 = local_50;
        if (u.uprops[0x1c].intrinsic == 0) {
          if (level->locations[x][iVar9].typ == ' ') {
            pline("You need to dig up the grave to effectively loot it...");
            uVar14 = local_50;
          }
        }
        else {
          obj = &invent;
          do {
            obj = &((obj *)obj)->nobj->nobj;
            if ((obj *)obj == (obj *)0x0) goto LAB_002126a3;
          } while (((obj *)obj)->oclass != '\f');
          iVar2 = ((obj *)obj)->quan;
          if (0x7ffe < ((obj *)obj)->quan) {
            iVar2 = 0x7fff;
          }
          uVar10 = mt_random();
          uVar10 = SUB164(ZEXT416(uVar10) % SEXT816((long)iVar2),0) + 1;
          if ((int)uVar10 < ((obj *)obj)->quan) {
            obj = &splitobj((obj *)obj,(ulong)uVar10)->nobj;
          }
          freeinv((obj *)obj);
          if (level->locations[u.ux][u.uy].typ == '\x1d') {
            poVar7 = level->objlist;
            iVar2 = 2;
            do {
              for (; poVar7 != (obj *)0x0; poVar7 = poVar7->nobj) {
                if (((ushort)(poVar7->otyp - 0xdbU) < 2) && (iVar2 == poVar7->spe))
                goto LAB_002125dc;
              }
              bVar15 = iVar2 != 0;
              poVar7 = level->objlist;
              iVar2 = iVar2 + -2;
            } while (bVar15);
            poVar7 = (obj *)0x0;
LAB_002125dc:
            if (poVar7 == (obj *)0x0) {
              ptr = courtmon(local_38);
              pmVar13 = makemon(ptr,level,(int)u.ux,(int)u.uy,0);
              if (pmVar13 != (monst *)0x0) {
                add_to_minv(pmVar13,(obj *)obj);
                pline("The exchequer accepts your contribution.");
                uVar3 = mt_random();
                uVar10 = 1;
                uVar14 = local_50;
                if ((uVar3 * -0x3d70a3d7 >> 1 | (uint)((uVar3 * -0x3d70a3d7 & 1) != 0) << 0x1f) <
                    0x51eb852) {
                  level->locations[u.ux][u.uy].typ = '\x19';
                  pline("The throne vanishes in a puff of logic.");
                  newsym((int)u.ux,(int)u.uy);
                  uVar14 = local_50;
                }
                goto LAB_002126a3;
              }
              dropy((obj *)obj);
            }
            else {
              verbalize("Thank you for your contribution to reduce the debt.");
              add_to_container(poVar7,(obj *)obj);
              uVar10 = weight(poVar7);
              poVar7->owt = uVar10;
            }
          }
          else {
            dropy((obj *)obj);
            pline("Ok, now there is loot here.");
          }
          uVar10 = 1;
          uVar14 = local_50;
        }
      }
      else {
        bVar1 = able_to_loot(x,iVar9,"loot");
        if (bVar1 == '\0') {
LAB_002124f6:
          bVar15 = false;
          uVar14 = 0;
        }
        else {
          uVar3 = query_objlist("Loot which containers?",level->objects[local_53.x][local_53.y],
                                (uint)(level->locations[local_53.x][local_53.y].typ == '\x1e') *
                                0x80 + (uint)(iflags.paranoid_loot == '\0') * 2 + 0x21,&local_40,2,
                                Is_container_func);
          if ((int)uVar3 < 0) goto LAB_002124f6;
          if (uVar3 == 0) {
            iVar5 = 0x6e;
            bVar15 = true;
            uVar14 = local_50;
          }
          else {
            lVar11 = 0;
            do {
              __ptr = (void *)CONCAT71(local_40._1_7_,(char)local_40);
              poVar7 = *(obj **)((long)__ptr + lVar11);
              if (poVar7 == &zeroobj) {
                pline("You carefully open the magic chest...");
LAB_00212432:
                bVar15 = false;
                uVar4 = use_container(poVar7,0);
                uVar10 = uVar10 | uVar4;
                if (multi < 0) {
                  local_50 = 1;
                  goto LAB_00212680;
                }
              }
              else {
                if ((poVar7->field_0x4b & 0x20) == 0) {
                  if ((poVar7->otyp != 0xe1) || (poVar7->spe < '\x01')) {
                    pcVar6 = xname(poVar7);
                    the(pcVar6);
                    pline("You carefully open %s...");
                    goto LAB_00212432;
                  }
                  pline("You carefully open the bag...");
                  pcVar6 = "teeth and bites";
                  if (((u.uprops[0x23].intrinsic != 0) &&
                      (pcVar6 = "teeth and bites", u.uprops[0x24].extrinsic == 0)) &&
                     (pcVar6 = "lips and kisses", u.umonnum != u.umonster)) {
                    bVar1 = dmgtype(youmonst.data,0x24);
                    pcVar6 = "teeth and bites";
                    if (bVar1 == '\0') {
                      pcVar6 = "lips and kisses";
                    }
                  }
                  pline("It develops a huge set of %s you!",pcVar6);
                  uVar4 = mt_random();
                  uVar3 = uVar4 % 10 + 2 >> 1;
                  if (u.uprops[0x33].extrinsic == 0 && u.uprops[0x33].intrinsic == 0) {
                    uVar3 = uVar4 % 10 + 1;
                  }
                  pcVar6 = "carnivorous bag";
                  if (((u.uprops[0x23].intrinsic != 0) &&
                      (pcVar6 = "carnivorous bag", u.uprops[0x24].extrinsic == 0)) &&
                     (pcVar6 = "amorous bag", u.umonnum != u.umonster)) {
                    bVar1 = dmgtype(youmonst.data,0x24);
                    pcVar6 = "carnivorous bag";
                    if (bVar1 == '\0') {
                      pcVar6 = "amorous bag";
                    }
                  }
                  bVar15 = false;
                  losehp(uVar3,pcVar6,0);
                  local_50 = 1;
                  discover_object(0xe1,'\x01','\x01');
                  goto LAB_00212680;
                }
                pline("Hmmm, it seems to be locked.");
                if (flags.autounlock != '\0') {
                  iVar5 = 0xf2;
                  if (poVar7->otyp == 0xdc) {
LAB_002124b0:
                    poVar7 = carrying(iVar5);
                  }
                  else {
                    poVar7 = carrying(0xe2);
                    if (poVar7 == (obj *)0x0) {
                      poVar7 = carrying(0xe3);
                    }
                    if (poVar7 == (obj *)0x0) {
                      iVar5 = 0xe4;
                      goto LAB_002124b0;
                    }
                  }
                  if (poVar7 != (obj *)0x0) {
                    iVar5 = pick_lock(poVar7,(int)local_53.x,(int)local_53.y,'\x01','\x01');
                    if (iVar5 != 0) {
                      local_50 = 1;
                      __ptr = (void *)CONCAT71(local_40._1_7_,(char)local_40);
                      bVar15 = false;
                      goto LAB_00212680;
                    }
                  }
                }
              }
              lVar11 = lVar11 + 0x10;
            } while ((ulong)uVar3 << 4 != lVar11);
            bVar15 = true;
            __ptr = (void *)CONCAT71(local_40._1_7_,(char)local_40);
LAB_00212680:
            free(__ptr);
            iVar5 = 0x79;
            uVar14 = local_50;
          }
        }
        if (!bVar15) goto LAB_00212b49;
      }
LAB_002126a3:
      if (iVar5 != 0x79) {
        uVar8 = (ulong)(uint)(int)u.uy;
        iVar2 = -1;
        do {
          iVar9 = -1;
          do {
            uVar3 = u.uy + iVar9;
            if (((uVar3 < 0x15 && (iVar2 + u.ux) - 1U < 0x4f) &&
                (pmVar13 = level->monsters[(uint)(iVar2 + u.ux)][uVar3], pmVar13 != (monst *)0x0))
               && ((pmVar13->field_0x61 & 2) == 0)) {
              iVar2 = get_adjacent_loc("Loot in what direction?","Invalid loot location",u.ux,u.uy,
                                       &local_53,(schar *)&local_40);
              if (iVar2 == 0) {
LAB_002128ca:
                local_50 = (ulong)uVar10;
LAB_002128cd:
                iVar2 = 1;
              }
              else {
                iVar2 = (int)local_53.x;
                bVar15 = true;
                local_50 = uVar14;
                if (local_53.x == u.ux) {
                  if (local_53.y != u.uy) goto LAB_00212794;
                  bVar15 = false;
                  iVar9 = container_at(iVar2,(int)local_53.y,'\0');
                  local_48 = (undefined4)CONCAT71((int7)(uVar8 >> 8),1);
                  if (iVar9 == 0) goto LAB_0021279c;
                  iVar2 = 2;
                }
                else {
LAB_00212794:
                  local_48 = 0;
LAB_0021279c:
                  if ((char)local_40 < '\0') {
                    pcVar6 = ceiling(iVar2,(int)local_53.y);
                    pline("You %s to loot on the %s.","don\'t find anything",pcVar6);
                    uVar10 = 1;
                    local_50 = 1;
                    goto LAB_002128cd;
                  }
                  pmVar13 = level->monsters[iVar2][local_53.y];
                  if (pmVar13 == (monst *)0x0) {
                    pmVar13 = (monst *)0x0;
                  }
                  else if ((pmVar13->field_0x61 & 2) != 0) {
                    pmVar13 = (monst *)0x0;
                  }
                  if (pmVar13 != (monst *)0x0) {
                    uVar10 = loot_mon(pmVar13,&local_44,&local_51);
                  }
                  if (bVar15) {
                    iVar2 = container_at((int)local_53.x,(int)local_53.y,'\0');
                    if (iVar2 == 0) {
                      pcVar6 = "";
                      if (local_51 != '\0') {
                        pcVar6 = "else ";
                      }
                      if (local_44 != 0) {
                        pcVar6 = "else ";
                      }
                      line = "You %s %sthere to loot.";
                      pcVar12 = "don\'t find anything";
                    }
                    else {
                      if (pmVar13 == (monst *)0x0) {
                        iVar2 = 0;
                        pline("You have to be at a container to loot it.");
                        goto LAB_002128d2;
                      }
                      pcVar12 = "else ";
                      if (local_44 == 0) {
                        pcVar12 = "";
                      }
                      pcVar6 = mon_nam(pmVar13);
                      line = "You can\'t loot anything %sthere with %s in the way.";
                    }
                    local_48 = 0;
                    pline(line,pcVar12,pcVar6);
                    goto LAB_002128ca;
                  }
                  iVar2 = 0;
                }
              }
LAB_002128d2:
              if (iVar2 == 2) goto LAB_002122fe;
              uVar14 = local_50;
              if (iVar2 != 0) goto LAB_00212b49;
              goto LAB_00212b46;
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 != 2);
          iVar2 = iVar2 + 1;
        } while (iVar2 != 2);
        if ((iVar5 != 0x6e) && (iVar5 != 0x79)) {
          pcVar6 = "here";
          if ((char)local_48 == '\0') {
            pcVar6 = "there";
          }
          pline("You %s %s to loot.","don\'t find anything",pcVar6);
        }
      }
LAB_00212b46:
      uVar14 = (ulong)uVar10;
      goto LAB_00212b49;
    }
    uVar14 = 0;
    pline("You have no hands!");
  }
LAB_00212b49:
  return (int)uVar14;
}

Assistant:

int doloot(void)
{
    struct obj *cobj, *pobj;
    int c = -1;
    int timepassed = 0;
    coord cc;
    boolean underfoot = TRUE;
    const char *dont_find_anything = "don't find anything";
    struct monst *mtmp;
    int prev_inquiry = 0;
    boolean prev_loot = FALSE;
    int container_count = 0;

    if (check_capacity(NULL)) {
	/* "Can't do that while carrying so much stuff." */
	return 0;
    }
    if (nohands(youmonst.data)) {
	pline("You have no hands!");	/* not `body_part(HAND)' */
	return 0;
    }
    cc.x = u.ux; cc.y = u.uy;

lootcont:

    if ((container_count = container_at(cc.x, cc.y, TRUE))) {
	struct object_pick *lootlist;
	int i, n;
	int qflags;

	if (!able_to_loot(cc.x, cc.y, "loot")) return 0;

	qflags = BY_NEXTHERE|SIGNAL_ESCAPE;
	if (!iflags.paranoid_loot)
	    qflags |= AUTOSELECT_SINGLE;
	if (IS_MAGIC_CHEST(level->locations[cc.x][cc.y].typ))
	    qflags |= SHOW_MAGIC_CHEST;
	n = query_objlist("Loot which containers?", level->objects[cc.x][cc.y],
			  qflags, &lootlist, PICK_ANY, Is_container_func);

	if (n < 0) {
	    return 0;
	} else if (n == 0) {
	    c = 'n';
	} else if (n > 0) {
	    c = 'y';
	    for (i = 0; i < n; i++) {
		cobj = lootlist[i].obj;
		if (!cobj_is_magic_chest(cobj) && cobj->olocked) {
		    pline("Hmmm, it seems to be locked.");
		    if (flags.autounlock) {
			pobj = NULL;
			if (cobj->otyp == IRON_SAFE) {
			    pobj = carrying(STETHOSCOPE);
			} else {
			    pobj = carrying(SKELETON_KEY);
			    if (!pobj) pobj = carrying(LOCK_PICK);
			    if (!pobj) pobj = carrying(CREDIT_CARD);
			}
			if (pobj) {
			    if (pick_lock(pobj, cc.x, cc.y, TRUE, TRUE)) {
				/* Non-zero return technically only means it
				 * took time, but it also conveniently means
				 * that unlocking is beginning to take place,
				 * so duck out of this container loop in that
				 * case. */
				free(lootlist);
				return 1;
			    }
			}
		    }
		    continue;
		}
		if (!cobj_is_magic_chest(cobj) &&
			cobj->otyp == BAG_OF_TRICKS && cobj->spe > 0) {
		    int tmp;
		    pline("You carefully open the bag...");
		    pline("It develops a huge set of %s you!",
			  Hallucination ? "lips and kisses" : "teeth and bites");
		    tmp = rnd(10);
		    if (Half_physical_damage) tmp = (tmp+1) / 2;
		    losehp(tmp, Hallucination ? "amorous bag" : "carnivorous bag",
			   KILLED_BY_AN);
		    makeknown(BAG_OF_TRICKS);
		    free(lootlist);
		    return 1;
		}

		if (cobj_is_magic_chest(cobj))
		    pline("You carefully open the magic chest...");
		else
		    pline("You carefully open %s...", the(xname(cobj)));
		timepassed |= use_container(cobj, 0);
		if (multi < 0) {
		    /* container trap or BoHsplosion */
		    free(lootlist);
		    return 1;
		}
	    }
	    free(lootlist);
	}
    } else if (Confusion) {
	struct obj *goldob;
	/* Find a money object to mess with */
	for (goldob = invent; goldob; goldob = goldob->nobj) {
	    if (goldob->oclass == COIN_CLASS) break;
	}
	if (goldob){
	    long contribution = rnd((int)min(LARGEST_INT, goldob->quan));
	    if (contribution < goldob->quan)
		goldob = splitobj(goldob, contribution);
	    freeinv(goldob);

	    if (IS_THRONE(level->locations[u.ux][u.uy].typ)){
		struct obj *coffers;
		int pass;
		/* find the original coffers chest, or any chest */
		for (pass = 2; pass > -1; pass -= 2)
		    for (coffers = level->objlist; coffers; coffers = coffers->nobj)
			if ((coffers->otyp == CHEST || coffers->otyp == IRON_SAFE) && coffers->spe == pass)
			    goto gotit;	/* two level break */
gotit:
		if (coffers) {
	    verbalize("Thank you for your contribution to reduce the debt.");
		    add_to_container(coffers, goldob);
		    coffers->owt = weight(coffers);
		} else {
		    struct monst *mon = makemon(courtmon(&u.uz), level,
					    u.ux, u.uy, NO_MM_FLAGS);
		    if (mon) {
			add_to_minv(mon, goldob);
			pline("The exchequer accepts your contribution.");
			if (!rn2(50)) {
			    level->locations[u.ux][u.uy].typ = ROOM;
			    pline("The throne vanishes in a puff of logic.");
			    newsym(u.ux,u.uy);
			}
		    } else {
			dropy(goldob);
		    }
		}
	    } else {
		dropy(goldob);
		pline("Ok, now there is loot here.");
	    }
	    timepassed = 1;
	}
    } else if (IS_GRAVE(level->locations[cc.x][cc.y].typ)) {
	pline("You need to dig up the grave to effectively loot it...");
    }
    /*
     * 3.3.1 introduced directional looting for some things.
     */
    if (c != 'y' && mon_beside(u.ux, u.uy)) {
	schar dz;
	if (!get_adjacent_loc("Loot in what direction?", "Invalid loot location",
			u.ux, u.uy, &cc, &dz))
	    return timepassed;
	if (cc.x == u.ux && cc.y == u.uy) {
	    underfoot = TRUE;
	    if (container_at(cc.x, cc.y, FALSE))
		goto lootcont;
	} else
	    underfoot = FALSE;
	if (dz < 0) {
	    pline("You %s to loot on the %s.", dont_find_anything,
		ceiling(cc.x, cc.y));
	    timepassed = 1;
	    return timepassed;
	}
	mtmp = m_at(level, cc.x, cc.y);
	if (mtmp) timepassed = loot_mon(mtmp, &prev_inquiry, &prev_loot);

	/* Preserve pre-3.3.1 behaviour for containers.
	 * Adjust this if-block to allow container looting
	 * from one square away to change that in the future.
	 */
	if (!underfoot) {
	    if (container_at(cc.x, cc.y, FALSE)) {
		if (mtmp) {
		    pline("You can't loot anything %sthere with %s in the way.",
			    prev_inquiry ? "else " : "", mon_nam(mtmp));
		    return timepassed;
		} else {
		    pline("You have to be at a container to loot it.");
		}
	    } else {
		pline("You %s %sthere to loot.", dont_find_anything,
			(prev_inquiry || prev_loot) ? "else " : "");
		return timepassed;
	    }
	}
    } else if (c != 'y' && c != 'n') {
	pline("You %s %s to loot.", dont_find_anything,
		    underfoot ? "here" : "there");
    }
    return timepassed;
}